

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<std::complex<long_double>_>::Solve_LDLt
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B,
          list<long,_std::allocator<long>_> *singular)

{
  int iVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int result;
  undefined4 local_4;
  
  iVar1 = (**(code **)(*in_RDI + 0xd0))(in_RDI,in_RDX);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    (**(code **)(*in_RDI + 0x230))(in_RDI,in_RSI);
    (**(code **)(*in_RDI + 0x240))(in_RDI,in_RSI);
    local_4 = (**(code **)(*in_RDI + 0x238))(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Solve_LDLt( TPZFMatrix<TVar>* B, std::list<int64_t> &singular ) {
    
    int result = Decompose_LDLt(singular);
    if (result == 0) {
        return result;
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("On input " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_LForward( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("Only forward " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    Subst_Diag( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("After forward and diagonal " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    result = Subst_LBackward( B );
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        B->Print("Final result " , sout);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    return result;
}